

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O3

void __thiscall ser::CentralizedFileFormat::WriteTables(CentralizedFileFormat *this,string *param_1)

{
  size_t *psVar1;
  pointer pcVar2;
  char *pcVar3;
  internalJSONNode *orig;
  ostream *poVar4;
  json_string *pjVar5;
  JSONNode offsetTableNode;
  JSONNode fieldsTableNode;
  JSONNode globalInfoNode;
  ofstream fs;
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  json_string local_238;
  _Alloc_hider local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  GlobalInfoToJSON((CentralizedFileFormat *)local_240);
  FieldsTable::TableToJSON((FieldsTable *)(local_250 + 8));
  OffsetTable::TableToJSON((OffsetTable *)local_250);
  orig = internalJSONNode::newInternal('\x05');
  if (1 < orig->refcount) {
    orig->refcount = orig->refcount - 1;
    orig = internalJSONNode::newInternal(orig);
  }
  internalJSONNode::push_back(orig,(JSONNode *)local_240);
  if (1 < orig->refcount) {
    orig->refcount = orig->refcount - 1;
    orig = internalJSONNode::newInternal(orig);
  }
  internalJSONNode::push_back(orig,(JSONNode *)(local_250 + 8));
  if (1 < orig->refcount) {
    orig->refcount = orig->refcount - 1;
    orig = internalJSONNode::newInternal(orig);
  }
  internalJSONNode::push_back(orig,(JSONNode *)local_250);
  std::ofstream::ofstream(&local_218,(this->databaseFile_)._M_dataplus._M_p,_S_out);
  pcVar3 = local_240 + 0x18;
  local_238._M_dataplus._M_p = pcVar3;
  if ((orig->_type & 0xfe) == 4) {
    local_238._M_string_length = 0;
    local_238.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)(local_240 + 8));
    internalJSONNode::Write(orig,0,true,(json_string *)(local_240 + 8));
  }
  else {
    pjVar5 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
    pcVar2 = (pjVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_240 + 8),pcVar2,pcVar2 + pjVar5->_M_string_length);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (local_238._M_dataplus._M_p != pcVar3) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_218._M_p = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  psVar1 = &orig->refcount;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    internalJSONNode::deleteInternal(orig);
  }
  if ((internalJSONNode *)local_250._0_8_ != (internalJSONNode *)0x0) {
    psVar1 = (size_t *)(local_250._0_8_ + 0x60);
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      internalJSONNode::deleteInternal((internalJSONNode *)local_250._0_8_);
    }
  }
  if ((internalJSONNode *)local_250._8_8_ != (internalJSONNode *)0x0) {
    psVar1 = (size_t *)(local_250._8_8_ + 0x60);
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      internalJSONNode::deleteInternal((internalJSONNode *)local_250._8_8_);
    }
  }
  if (local_240 != (undefined1  [8])0x0) {
    psVar1 = (size_t *)((long)local_240 + 0x60);
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      internalJSONNode::deleteInternal((internalJSONNode *)local_240);
    }
  }
  return;
}

Assistant:

void CentralizedFileFormat::WriteTables(const std::string&)
{
    // Discard fieldName, as both tables are written completely onto the file

    JSONNode globalInfoNode = GlobalInfoToJSON();
    JSONNode fieldsTableNode = pFieldsTable_->TableToJSON();
    JSONNode offsetTableNode = pOffsetTable_->TableToJSON();

    JSONNode mainNode;
    mainNode.push_back(globalInfoNode);
    mainNode.push_back(fieldsTableNode);
    mainNode.push_back(offsetTableNode);

    std::ofstream fs(databaseFile_.c_str());
    fs << mainNode.write_formatted() << "\n";
    fs.close();
}